

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O0

void tcg_out_vex_opc(TCGContext_conflict9 *s,int opc,int r,int v,int rm,int index)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte local_28;
  int tmp;
  int index_local;
  int rm_local;
  int v_local;
  int r_local;
  int opc_local;
  TCGContext_conflict9 *s_local;
  
  if (((opc & 0x11300U) == 0x100) && (((rm | index) & 8U) == 0)) {
    tcg_out8(s,0xc5);
    bVar1 = 0x80;
    if ((r & 8U) != 0) {
      bVar1 = 0;
    }
  }
  else {
    tcg_out8(s,0xc4);
    if ((opc & 0x10000U) == 0) {
      if ((opc & 0x200U) == 0) {
        if ((opc & 0x100U) == 0) {
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
                     ,0x29d,(char *)0x0);
        }
        local_28 = 1;
      }
      else {
        local_28 = 2;
      }
    }
    else {
      local_28 = 3;
    }
    bVar1 = 0x80;
    if ((r & 8U) != 0) {
      bVar1 = 0;
    }
    bVar2 = 0x40;
    if ((index & 8U) != 0) {
      bVar2 = 0;
    }
    bVar3 = 0x20;
    if ((rm & 8U) != 0) {
      bVar3 = 0;
    }
    tcg_out8(s,bVar3 | bVar2 | bVar1 | local_28);
    bVar1 = 0;
    if ((opc & 0x1000U) != 0) {
      bVar1 = 0x80;
    }
  }
  bVar2 = 0;
  if ((opc & 0x80000U) != 0) {
    bVar2 = 4;
  }
  bVar2 = bVar2 | bVar1;
  if ((opc & 0x400U) == 0) {
    if ((opc & 0x20000U) == 0) {
      if ((opc & 0x40000U) != 0) {
        bVar2 = bVar2 | 3;
      }
    }
    else {
      bVar2 = bVar2 | 2;
    }
  }
  else {
    bVar2 = bVar2 | 1;
  }
  tcg_out8(s,(byte)(((v ^ 0xffffffffU) & 0xf) << 3) | bVar2);
  tcg_out8(s,(uint8_t)opc);
  return;
}

Assistant:

static void tcg_out_vex_opc(TCGContext *s, int opc, int r, int v,
                            int rm, int index)
{
    int tmp = 0;

    /* Use the two byte form if possible, which cannot encode
       VEX.W, VEX.B, VEX.X, or an m-mmmm field other than P_EXT.  */
    if ((opc & (P_EXT | P_EXT38 | P_EXT3A | P_REXW)) == P_EXT
        && ((rm | index) & 8) == 0) {
        /* Two byte VEX prefix.  */
        tcg_out8(s, 0xc5);

        tmp = (r & 8 ? 0 : 0x80);              /* VEX.R */
    } else {
        /* Three byte VEX prefix.  */
        tcg_out8(s, 0xc4);

        /* VEX.m-mmmm */
        if (opc & P_EXT3A) {
            tmp = 3;
        } else if (opc & P_EXT38) {
            tmp = 2;
        } else if (opc & P_EXT) {
            tmp = 1;
        } else {
            g_assert_not_reached();
        }
        tmp |= (r & 8 ? 0 : 0x80);             /* VEX.R */
        tmp |= (index & 8 ? 0 : 0x40);         /* VEX.X */
        tmp |= (rm & 8 ? 0 : 0x20);            /* VEX.B */
        tcg_out8(s, tmp);

        tmp = (opc & P_REXW ? 0x80 : 0);       /* VEX.W */
    }

    tmp |= (opc & P_VEXL ? 0x04 : 0);      /* VEX.L */
    /* VEX.pp */
    if (opc & P_DATA16) {
        tmp |= 1;                          /* 0x66 */
    } else if (opc & P_SIMDF3) {
        tmp |= 2;                          /* 0xf3 */
    } else if (opc & P_SIMDF2) {
        tmp |= 3;                          /* 0xf2 */
    }
    tmp |= (~v & 15) << 3;                 /* VEX.vvvv */
    tcg_out8(s, tmp);
    tcg_out8(s, opc);
}